

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRenderer::DebugXmlRules
          (GdlRenderer *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur)

{
  int iVar1;
  GdlRuleTable *pGVar2;
  GrcManager *pcman_00;
  ostream *poVar3;
  GdlRuleTable *pGVar4;
  string *in_RCX;
  string *in_RDX;
  GdlRenderer *in_RDI;
  GdlRuleTable *prultbl;
  string *in_stack_fffffffffffffe30;
  allocator *staTableName;
  GrcManager *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  GrcManager *in_stack_fffffffffffffe58;
  GdlRuleTable *in_stack_fffffffffffffe60;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  undefined1 local_a1 [33];
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  GrcManager *local_28;
  string *local_18;
  
  local_18 = in_RDX;
  std::operator<<((ostream *)in_RDX,"  <rules>\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"linebreak",&local_49);
  pGVar2 = FindRuleTable((GdlRenderer *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  local_28 = (GrcManager *)pGVar2;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pGVar2 != (GdlRuleTable *)0x0) {
    std::__cxx11::string::string(local_80,in_RCX);
    GdlRuleTable::DebugXmlRules
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (ofstream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_80);
  }
  pGVar2 = (GdlRuleTable *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a1 + 1),"substitution",(allocator *)pGVar2);
  pcman_00 = (GrcManager *)
             FindRuleTable((GdlRenderer *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  local_28 = pcman_00;
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  if (pcman_00 != (GrcManager *)0x0) {
    in_stack_fffffffffffffe50 = local_c8;
    in_stack_fffffffffffffe38 = local_28;
    in_stack_fffffffffffffe48 = local_18;
    std::__cxx11::string::string(in_stack_fffffffffffffe50,in_RCX);
    GdlRuleTable::DebugXmlRules
              (pGVar2,pcman_00,(ofstream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_c8);
  }
  iVar1 = RawBidi(in_RDI);
  if (iVar1 == 2) {
    poVar3 = std::operator<<((ostream *)local_18,"    <pass table=\"bidi\" index=\"");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->m_ipassBidi + 1);
    std::operator<<(poVar3,"\" />\n");
  }
  staTableName = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"justification",staTableName);
  pGVar4 = FindRuleTable((GdlRenderer *)in_stack_fffffffffffffe38,(string *)staTableName);
  local_28 = (GrcManager *)pGVar4;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (pGVar4 != (GdlRuleTable *)0x0) {
    std::__cxx11::string::string(local_110,in_RCX);
    GdlRuleTable::DebugXmlRules
              (pGVar2,pcman_00,(ofstream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_110);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"positioning",&local_131);
  pGVar4 = FindRuleTable((GdlRenderer *)in_stack_fffffffffffffe38,(string *)staTableName);
  local_28 = (GrcManager *)pGVar4;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  if (pGVar4 != (GdlRuleTable *)0x0) {
    std::__cxx11::string::string(local_158,in_RCX);
    GdlRuleTable::DebugXmlRules
              (pGVar2,pcman_00,(ofstream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_158);
  }
  std::operator<<((ostream *)local_18,"  </rules>\n\n");
  return;
}

Assistant:

void GdlRenderer::DebugXmlRules(GrcManager * pcman, std::ofstream & strmOut,
	std::string staPathToCur)
{
	strmOut << "  <rules>\n";

	GdlRuleTable * prultbl;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if (RawBidi() == kFullPass)
		strmOut << "    <pass table=\"bidi\" index=\"" << m_ipassBidi + 1 << "\" />\n";

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	strmOut << "  </rules>\n\n";
}